

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O1

void __thiscall
directed_flag_complex_computer::store_coboundaries_in_cache_t::operator()
          (store_coboundaries_in_cache_t *this,vertex_index_t *first_vertex,int size)

{
  uint uVar1;
  ostream *poVar2;
  filtered_directed_graph_t *pfVar3;
  iterator iVar4;
  runtime_error *this_00;
  short sVar5;
  ulong uVar6;
  ulong uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_offsets;
  string err;
  ulong local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  key_type local_b0;
  ulong local_a0;
  ushort local_98 [4];
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ushort *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((this->is_first == true) &&
     (uVar1 = this->current_index * 0x3afb7e91 + 0x3b2fec51,
     (uVar1 >> 4 | uVar1 * 0x10000000) < 0x68db9)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dimension ",10);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->current_dimension);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": computed ca. ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    if (this->total_cell_number != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," coboundaries",0xd);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r",1);
  }
  compressed_sparse_matrix<entry_t>::append_column(this->coboundary_matrix);
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  uVar11 = (ulong)(uint)size;
  if (0 < size) {
    uVar9 = 0;
    do {
      local_b0._vptr_directed_flag_complex_cell_t = (_func_int **)(ulong)(first_vertex[uVar9] >> 6);
      if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_b0);
      }
      else {
        *local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (unsigned_long)local_b0._vptr_directed_flag_complex_cell_t;
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  if (-1 < size) {
    local_90 = (ulong)(size + 1);
    local_e0 = 0;
    local_88 = uVar11;
    do {
      pfVar3 = this->graph;
      uVar9 = (pfVar3->super_directed_graph_t).incidence_row_length;
      if (uVar9 != 0) {
        local_80 = local_e0 & 0xffff;
        local_78 = (ushort *)((long)first_vertex - (ulong)((uint)((local_e0 & 0xffff) == 0) * 2));
        if (local_80 == 0) {
          local_78 = local_98;
        }
        uVar6 = 0;
        do {
          if (size == 0) {
            uVar10 = 0xffffffffffffffff;
          }
          else {
            uVar10 = 0xffffffffffffffff;
            uVar7 = 0;
            do {
              if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar7] == uVar6) {
                uVar10 = uVar10 & ~(1L << ((ulong)(byte)first_vertex[uVar7] & 0x3f));
              }
              pvVar8 = &(pfVar3->super_directed_graph_t).incidence_outgoing;
              if (local_e0 <= uVar7) {
                pvVar8 = &(pfVar3->super_directed_graph_t).incidence_incoming;
              }
              uVar10 = uVar10 & (pvVar8->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start
                                [first_vertex[uVar7] * uVar9 + uVar6];
            } while ((uVar10 != 0) && (uVar7 = uVar7 + 1, uVar7 < uVar11));
          }
          if (uVar10 != 0) {
            do {
              uVar11 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              local_98[0] = (ushort)uVar11 | (ushort)(uVar6 << 6);
              local_b0._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_0014f248;
              local_a0 = local_80;
              sVar5 = (short)((ulong)*local_78 % this->nb_threads);
              local_b0.vertices = first_vertex;
              iVar4 = std::
                      _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)((this->cell_hash->
                                 super__Vector_base<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + sVar5),&local_b0);
              if (iVar4.
                  super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                local_50[0] = local_40;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_50,"Could not find coboundary ","");
                directed_flag_complex_cell_t::to_string_abi_cxx11_
                          (&local_70,&local_b0,(short)this->current_dimension + 1);
                std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)local_50);
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,(string *)local_50);
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              uVar9 = (ulong)(*(int *)&this->modulus - 1U & 0xffff) << 0x20;
              if ((local_e0 & 1) == 0) {
                uVar9 = 0x100000000;
              }
              compressed_sparse_matrix<entry_t>::push_back
                        (this->coboundary_matrix,
                         (entry_t)((uint)((int)(this->cell_hash_offsets->
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               )._M_impl.super__Vector_impl_data._M_start[sVar5] +
                                         *(int *)((long)iVar4.
                                                  super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
                                                  ._M_cur + 0x18)) | uVar9));
              uVar10 = uVar10 & ~(1L << (uVar11 & 0x3f));
            } while (uVar10 != 0);
          }
          uVar6 = uVar6 + 1;
          pfVar3 = this->graph;
          uVar9 = (pfVar3->super_directed_graph_t).incidence_row_length;
          uVar11 = local_88;
        } while (uVar6 < uVar9);
      }
      local_e0 = local_e0 + 1;
    } while (local_e0 != local_90);
  }
  this->current_index = this->current_index + 1;
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size) {
#ifdef INDICATE_PROGRESS
		if (is_first && (current_index + 1) % 10000 == 0) {
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed ca. " << nb_threads * (current_index + 1);
			if (total_cell_number > 0) std::cout << "/" << total_cell_number;
			std::cout << " coboundaries" << std::flush << "\r";
		}
#endif
		directed_flag_complex_cell_t cell(first_vertex);
		coboundary_matrix.append_column();

		std::vector<size_t> vertex_offsets;
		for (int j = 0; j < size; j++) vertex_offsets.push_back(first_vertex[j] >> 6);

		for (int i = 0; i <= size; i++) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
				size_t bits = -1; // All bits set

				for (int j = 0; bits > 0 && j < size; j++) {
					// Remove the vertices already making up the cellk
					if (vertex_offsets[j] == offset) bits &= ~(ONE_ << (first_vertex[j] - (vertex_offsets[j] << 6)));

					// Intersect with the outgoing/incoming edges of the current
					// vertex
					bits &= j < i ? graph.get_outgoing_chunk(first_vertex[j], offset)
					              : graph.get_incoming_chunk(first_vertex[j], offset);
				}

				size_t vertex_offset = offset << 6;
				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					// Now insert the appropriate vertex at this position
					const auto& cb = cell.insert_vertex(i, vertex_index_t(vertex_offset + b));
					const short thread_index = cb.vertex(0) % nb_threads;
					auto pair = cell_hash[thread_index].find(cb);
					if (pair == cell_hash[thread_index].end()) {
						std::string err = "Could not find coboundary ";
						err += cb.to_string(current_dimension + 1);
						err += ".\n";
						throw std::runtime_error(err);
					}
					coboundary_matrix.push_back(
					    make_entry(index_t(pair->second + cell_hash_offsets[thread_index]), i & 1 ? -1 + modulus : 1));
				}
			}
		}

		current_index++;
	}